

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::Clipper::BuildResultEx(Clipper *this,ExPolygons *polys)

{
  long64 lVar1;
  int iVar2;
  pointer ppOVar3;
  ulong uVar4;
  OutPt *pOVar5;
  size_type __new_size;
  Polygon pg;
  ExPolygon epg;
  void *local_88;
  iterator iStack_80;
  IntPoint *local_78;
  ExPolygons *local_70;
  value_type local_68;
  
  __new_size = 0;
  std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::resize(polys,0);
  local_70 = polys;
  std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::reserve
            (polys,(long)(this->m_PolyOuts).
                         super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->m_PolyOuts).
                         super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
  ppOVar3 = (this->m_PolyOuts).
            super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_PolyOuts).
      super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppOVar3) {
    iVar2 = 0;
    uVar4 = 0;
    do {
      if (ppOVar3[uVar4]->pts == (OutPt *)0x0) break;
      local_68.holes.
      super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.holes.
      super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_68.outer.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (IntPoint *)0x0;
      local_68.holes.
      super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.outer.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.outer.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
      ._M_impl.super__Vector_impl_data._M_finish = (IntPoint *)0x0;
      pOVar5 = ppOVar3[uVar4]->pts;
      do {
        if (local_68.outer.
            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_68.outer.
            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>::
          _M_realloc_insert<ClipperLib::IntPoint_const&>
                    ((vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>> *)&local_68,
                     (iterator)
                     local_68.outer.
                     super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&pOVar5->pt);
        }
        else {
          lVar1 = (pOVar5->pt).Y;
          (local_68.outer.
           super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
           super__Vector_impl_data._M_finish)->X = (pOVar5->pt).X;
          (local_68.outer.
           super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
           super__Vector_impl_data._M_finish)->Y = lVar1;
          local_68.outer.
          super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_68.outer.
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        pOVar5 = pOVar5->next;
        ppOVar3 = (this->m_PolyOuts).
                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      } while (pOVar5 != ppOVar3[uVar4]->pts);
      uVar4 = uVar4 + 1;
      if (0x20 < (ulong)((long)local_68.outer.
                               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_68.outer.
                              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        while (((uVar4 < (ulong)((long)(this->m_PolyOuts).
                                       super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppOVar3 >>
                                3) && (ppOVar3[uVar4]->pts != (OutPt *)0x0)) &&
               (ppOVar3[uVar4]->isHole == true))) {
          local_88 = (void *)0x0;
          iStack_80._M_current = (IntPoint *)0x0;
          local_78 = (IntPoint *)0x0;
          pOVar5 = ppOVar3[uVar4]->pts;
          do {
            if (iStack_80._M_current == local_78) {
              std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>::
              _M_realloc_insert<ClipperLib::IntPoint_const&>
                        ((vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>> *)
                         &local_88,iStack_80,&pOVar5->pt);
            }
            else {
              lVar1 = (pOVar5->pt).Y;
              (iStack_80._M_current)->X = (pOVar5->pt).X;
              (iStack_80._M_current)->Y = lVar1;
              iStack_80._M_current = iStack_80._M_current + 1;
            }
            pOVar5 = pOVar5->next;
          } while (pOVar5 != (this->m_PolyOuts).
                             super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar4]->pts);
          std::
          vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
          ::push_back(&local_68.holes,(value_type *)&local_88);
          if (local_88 != (void *)0x0) {
            operator_delete(local_88,(long)local_78 - (long)local_88);
          }
          uVar4 = uVar4 + 1;
          ppOVar3 = (this->m_PolyOuts).
                    super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        }
        std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::push_back
                  (local_70,&local_68);
        iVar2 = iVar2 + 1;
      }
      std::
      vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
      ::~vector(&local_68.holes);
      if (local_68.outer.
          super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.outer.
                        super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_68.outer.
                              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.outer.
                              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      ppOVar3 = (this->m_PolyOuts).
                super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(this->m_PolyOuts).
                                   super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppOVar3 >> 3))
    ;
    __new_size = (size_type)iVar2;
  }
  std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::resize
            (local_70,__new_size);
  return;
}

Assistant:

void Clipper::BuildResultEx(ExPolygons &polys)
{
  PolyOutList::size_type i = 0;
  int k = 0;
  polys.resize(0);
  polys.reserve(m_PolyOuts.size());
  while (i < m_PolyOuts.size() && m_PolyOuts[i]->pts)
  {
    ExPolygon epg;
    OutPt* p = m_PolyOuts[i]->pts;
    do {
      epg.outer.push_back(p->pt);
      p = p->next;
    } while (p != m_PolyOuts[i]->pts);
    i++;
    //make sure polygons have at least 3 vertices ...
    if (epg.outer.size() < 3) continue;
    while (i < m_PolyOuts.size()
      && m_PolyOuts[i]->pts && m_PolyOuts[i]->isHole)
    {
      Polygon pg;
      p = m_PolyOuts[i]->pts;
      do {
        pg.push_back(p->pt);
        p = p->next;
      } while (p != m_PolyOuts[i]->pts);
      epg.holes.push_back(pg);
      i++;
    }
    polys.push_back(epg);
    k++;
  }
  polys.resize(k);
}